

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O0

GrowingAlignedDataBuffer * __thiscall
siamese::EncoderPacketWindow::GetSum
          (EncoderPacketWindow *this,uint laneIndex,uint sumIndex,uint elementEnd)

{
  uint uVar1;
  bool bVar2;
  reference pvVar3;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  uint8_t CX;
  uint addBytes;
  uint column;
  OriginalPacket *original;
  GrowingAlignedDataBuffer *sum;
  uint element;
  EncoderColumnLane *lane;
  LogStringBuffer buffer;
  undefined4 in_stack_fffffffffffffa78;
  uint in_stack_fffffffffffffa7c;
  Allocator *in_stack_fffffffffffffa80;
  OutputWorker *in_stack_fffffffffffffa88;
  LogStringBuffer *pLVar4;
  LogStringBuffer *buffer_00;
  OutputWorker *this_00;
  uint local_50c;
  long local_508;
  uint local_4fc;
  long local_4f8;
  uint local_4ec;
  uint local_4e8;
  uint local_4e4 [4];
  uint local_4d4;
  uint *local_4c8;
  char *local_4c0;
  uint *local_4b8;
  char *local_4b0;
  uint *local_4a8;
  char *local_4a0;
  undefined8 *local_498;
  uint local_48c;
  char local_485;
  uint local_484;
  long local_480;
  uint *local_478;
  char *local_470;
  uint *local_468;
  char *local_460;
  uint *local_458;
  char *local_450;
  undefined4 local_444;
  undefined8 *local_440;
  undefined4 local_434;
  undefined8 *local_430;
  int in_stack_fffffffffffffc8c;
  void *in_stack_fffffffffffffc90;
  void *in_stack_fffffffffffffc98;
  OutputWorker *in_stack_fffffffffffffe70;
  uint *in_stack_fffffffffffffe78;
  uint *puVar5;
  char *in_stack_fffffffffffffe80;
  char *pcVar6;
  uint *in_stack_fffffffffffffe88;
  uint *puVar7;
  
  local_4f8 = in_RDI + 0x118 + (ulong)in_ESI * 0x48;
  local_4fc = *(uint *)(local_4f8 + (ulong)in_EDX * 4);
  local_4e8 = in_EDX;
  if (local_4fc < in_ECX) {
    local_508 = local_4f8 + 0x10 + (ulong)in_EDX * 0x10;
    local_4ec = in_ECX;
    local_4e4[0] = in_ESI;
    if ((*(int *)(local_4f8 + 0x40) == 0) ||
       (bVar2 = GrowingAlignedDataBuffer::GrowZeroPadded
                          ((GrowingAlignedDataBuffer *)in_stack_fffffffffffffa88,
                           in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c), bVar2)) {
      do {
        local_50c = *(int *)(in_RDI + 0x18) + local_4fc;
        local_498 = &Logger;
        local_4a0 = "Lane ";
        local_4a8 = local_4e4;
        local_4b0 = " sum ";
        puVar7 = &local_4e8;
        local_4c0 = " accumulating column: ";
        puVar5 = &local_50c;
        local_440 = &Logger;
        local_444 = 2;
        local_450 = "Lane ";
        local_460 = " sum ";
        local_470 = " accumulating column: ";
        local_430 = &Logger;
        local_434 = 2;
        local_4c8 = puVar5;
        local_4b8 = puVar7;
        local_478 = puVar5;
        local_468 = puVar7;
        local_458 = local_4a8;
        if (DAT_002b6400 < 3) {
          pLVar4 = (LogStringBuffer *)&stack0xfffffffffffffbe8;
          logger::LogStringBuffer::LogStringBuffer
                    ((LogStringBuffer *)in_stack_fffffffffffffa80,
                     (char *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),Trace);
          in_stack_fffffffffffffa88 = (OutputWorker *)&Logger;
          buffer_00 = pLVar4;
          std::operator<<((ostream *)&pLVar4->LogStream,(string *)&DAT_002b6430);
          this_00 = in_stack_fffffffffffffa88;
          in_stack_fffffffffffffe70 = in_stack_fffffffffffffa88;
          std::operator<<((ostream *)&pLVar4->LogStream,"Lane ");
          pcVar6 = " accumulating column: ";
          std::ostream::operator<<((ostream *)&pLVar4->LogStream,local_4e4[0]);
          in_stack_fffffffffffffe78 = puVar5;
          in_stack_fffffffffffffe80 = pcVar6;
          in_stack_fffffffffffffe88 = puVar7;
          std::operator<<((ostream *)&pLVar4->LogStream," sum ");
          std::ostream::operator<<((ostream *)&pLVar4->LogStream,*puVar7);
          std::operator<<((ostream *)&pLVar4->LogStream,pcVar6);
          std::ostream::operator<<((ostream *)&pLVar4->LogStream,*puVar5);
          in_stack_fffffffffffffa80 = (Allocator *)logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(this_00,buffer_00);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1d7a86);
        }
        local_4d4 = local_4fc;
        local_480 = in_RDI + 0x38;
        local_484 = local_4fc >> 6;
        pvVar3 = std::array<siamese::OriginalPacket,_64UL>::operator[]
                           ((array<siamese::OriginalPacket,_64UL> *)in_stack_fffffffffffffa80,
                            CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
        uVar1 = pvVar3->Column;
        bVar2 = GrowingAlignedDataBuffer::GrowZeroPadded
                          ((GrowingAlignedDataBuffer *)in_stack_fffffffffffffa88,
                           in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c);
        if (!bVar2) {
          *(undefined1 *)(in_RDI + 0x438) = 1;
          goto LAB_001d7c2e;
        }
        if (local_4e8 == 0) {
          gf256_add_mem(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                        in_stack_fffffffffffffc8c);
        }
        else {
          if (local_4e8 == 2) {
            local_485 = (char)((ulong)(uVar1 * 199) % 0xfd) + '\x03';
          }
          local_48c = uVar1;
          gf256_muladd_mem(in_stack_fffffffffffffe88,
                           (uint8_t)((ulong)in_stack_fffffffffffffe80 >> 0x38),
                           in_stack_fffffffffffffe78,(int)((ulong)in_stack_fffffffffffffe70 >> 0x20)
                          );
        }
        local_4fc = local_4fc + 8;
      } while (local_4fc < local_4ec);
      *(uint *)(local_4f8 + (ulong)local_4e8 * 4) = local_4fc;
    }
    else {
      *(undefined1 *)(in_RDI + 0x438) = 1;
    }
  }
LAB_001d7c2e:
  return (GrowingAlignedDataBuffer *)(local_4f8 + 0x10 + (ulong)local_4e8 * 0x10);
}

Assistant:

const GrowingAlignedDataBuffer* EncoderPacketWindow::GetSum(unsigned laneIndex, unsigned sumIndex, unsigned elementEnd)
{
    EncoderColumnLane& lane = Lanes[laneIndex];
    unsigned element = lane.NextElement[sumIndex];
    SIAMESE_DEBUG_ASSERT(element % kColumnLaneCount == laneIndex);
    SIAMESE_DEBUG_ASSERT(element < Count + kColumnLaneCount);

    if (element < elementEnd)
    {
        GrowingAlignedDataBuffer& sum = lane.Sum[sumIndex];

        // Grow this sum for this lane to fit new (larger) data if needed
        if (lane.LongestPacket > 0 &&
            !sum.GrowZeroPadded(TheAllocator, lane.LongestPacket))
        {
            EmergencyDisabled = true;
            goto ExitSum;
        }

        do
        {
            Logger.Info("Lane ", laneIndex, " sum ", sumIndex, " accumulating column: ", ColumnStart + element);

            OriginalPacket* original = GetWindowElement(element);
            const unsigned column    = original->Column;
            unsigned addBytes        = original->Buffer.Bytes;

            if (!sum.GrowZeroPadded(TheAllocator, addBytes))
            {
                EmergencyDisabled = true;
                goto ExitSum;
            }

            SIAMESE_DEBUG_ASSERT(original->Buffer.Bytes <= sum.Bytes || element < FirstUnremovedElement);

            // Sum += PacketData
            if (sumIndex == 0) {
                gf256_add_mem(sum.Data, original->Buffer.Data, addBytes);
            }
            else
            {
                // Sum += CX[2] * PacketData
                uint8_t CX = GetColumnValue(column);
                if (sumIndex == 2) {
                    CX = gf256_sqr(CX);
                }
                gf256_muladd_mem(sum.Data, CX, original->Buffer.Data, addBytes);
            }

            SIAMESE_DEBUG_ASSERT(original->Column % kColumnLaneCount == laneIndex);
            element += kColumnLaneCount;
        } while (element < elementEnd);

        // Store next element to accumulate
        lane.NextElement[sumIndex] = element;
    }

ExitSum:
    return &lane.Sum[sumIndex];
}